

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InvalidExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*,slang::ast::Type_const&>
          (BumpAllocator *this,Expression **args,Type *args_1)

{
  Expression *pEVar1;
  InvalidExpression *pIVar2;
  
  pIVar2 = (InvalidExpression *)allocate(this,0x38,8);
  pEVar1 = *args;
  (pIVar2->super_Expression).kind = Invalid;
  (pIVar2->super_Expression).type.ptr = args_1;
  (pIVar2->super_Expression).sourceRange.startLoc = (SourceLocation)0x0;
  (pIVar2->super_Expression).sourceRange.endLoc = (SourceLocation)0x0;
  (pIVar2->super_Expression).constant = (ConstantValue *)0x0;
  (pIVar2->super_Expression).syntax = (ExpressionSyntax *)0x0;
  pIVar2->child = pEVar1;
  return pIVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }